

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O0

void __thiscall cmFindLibraryHelper::cmFindLibraryHelper(cmFindLibraryHelper *this,cmMakefile *mf)

{
  cmMakefile *pcVar1;
  bool bVar2;
  cmGlobalGenerator *pcVar3;
  string *psVar4;
  cmState *this_00;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  string *local_60;
  string *suffixes_list;
  string local_50;
  string *local_30;
  string *prefixes_list;
  cmMakefile *local_18;
  cmMakefile *mf_local;
  cmFindLibraryHelper *this_local;
  
  this->Makefile = mf;
  local_18 = mf;
  mf_local = (cmMakefile *)this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Prefixes);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Suffixes);
  std::__cxx11::string::string((string *)&this->PrefixRegexStr);
  std::__cxx11::string::string((string *)&this->SuffixRegexStr);
  std::__cxx11::string::string((string *)&this->BestPath);
  std::vector<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>::vector
            (&this->Names);
  std::__cxx11::string::string((string *)&this->TestPath);
  pcVar3 = cmMakefile::GetGlobalGenerator(this->Makefile);
  this->GG = pcVar3;
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"CMAKE_FIND_LIBRARY_PREFIXES",
             (allocator<char> *)((long)&suffixes_list + 7));
  psVar4 = cmMakefile::GetRequiredDefinition(pcVar1,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)((long)&suffixes_list + 7));
  pcVar1 = this->Makefile;
  local_30 = psVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"CMAKE_FIND_LIBRARY_SUFFIXES",&local_81);
  psVar4 = cmMakefile::GetRequiredDefinition(pcVar1,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  local_60 = psVar4;
  cmSystemTools::ExpandListArgument(local_30,&this->Prefixes,true);
  cmSystemTools::ExpandListArgument(local_60,&this->Suffixes,true);
  RegexFromList(this,&this->PrefixRegexStr,&this->Prefixes);
  RegexFromList(this,&this->SuffixRegexStr,&this->Suffixes);
  this_00 = cmMakefile::GetState(this->Makefile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"FIND_LIBRARY_USE_OPENBSD_VERSIONING",&local_a9);
  bVar2 = cmState::GetGlobalPropertyAsBool(this_00,&local_a8);
  this->OpenBSD = bVar2;
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  return;
}

Assistant:

cmFindLibraryHelper::cmFindLibraryHelper(cmMakefile* mf)
  : Makefile(mf)
{
  this->GG = this->Makefile->GetGlobalGenerator();

  // Collect the list of library name prefixes/suffixes to try.
  std::string const& prefixes_list =
    this->Makefile->GetRequiredDefinition("CMAKE_FIND_LIBRARY_PREFIXES");
  std::string const& suffixes_list =
    this->Makefile->GetRequiredDefinition("CMAKE_FIND_LIBRARY_SUFFIXES");
  cmSystemTools::ExpandListArgument(prefixes_list, this->Prefixes, true);
  cmSystemTools::ExpandListArgument(suffixes_list, this->Suffixes, true);
  this->RegexFromList(this->PrefixRegexStr, this->Prefixes);
  this->RegexFromList(this->SuffixRegexStr, this->Suffixes);

  // Check whether to use OpenBSD-style library version comparisons.
  this->OpenBSD = this->Makefile->GetState()->GetGlobalPropertyAsBool(
    "FIND_LIBRARY_USE_OPENBSD_VERSIONING");
}